

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

void __thiscall senjo::PerftCommandHandle::Execute(PerftCommandHandle *this)

{
  ChessEngine *pCVar1;
  int iVar2;
  Output *pOVar3;
  ulong uVar4;
  char *pcVar5;
  int *piVar6;
  undefined4 extraout_var;
  bool bVar7;
  exception *e;
  double local_40f8;
  char local_40e9;
  Output local_40e8;
  double local_40e0;
  char local_40d1;
  Output local_40d0;
  double local_40c8;
  unsigned_long local_40c0;
  Output local_40b8;
  double local_40b0;
  char local_40a1;
  Output local_40a0;
  uint64_t local_4098;
  uint64_t time;
  char *end;
  Output local_4080;
  int *local_4078;
  char *f;
  int line;
  int positions;
  char fen [16384];
  uint64_t uStack_60;
  bool done;
  uint64_t qnodes;
  uint64_t nodes;
  uint64_t pcount;
  uint64_t start;
  Output local_38;
  FILE *local_30;
  FILE *fp;
  Output local_18;
  PerftCommandHandle *local_10;
  PerftCommandHandle *this_local;
  
  local_10 = this;
  if ((this->super_BackgroundCommand).engine == (ChessEngine *)0x0) {
    Output::Output(&local_18,InfoPrefix);
    pOVar3 = Output::operator<<(&local_18,(char (*) [21])"Engine not set for \'");
    pOVar3 = Output::operator<<(pOVar3,&this->command);
    Output::operator<<(pOVar3,(char (*) [10])0x179091);
    Output::~Output(&local_18);
  }
  else {
    (*((this->super_BackgroundCommand).engine)->_vptr_ChessEngine[0x1e])();
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_30 = (FILE *)0x0;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_30 = fopen(pcVar5,"r");
      if (local_30 != (FILE *)0x0) {
        pcount = Now();
        nodes = 0;
        qnodes = 0;
        uStack_60 = 0;
        fen[0x3fff] = '\0';
        f._4_4_ = 0;
        f._0_4_ = 1;
        do {
          bVar7 = false;
          if ((fen[0x3fff] & 1U) == 0) {
            pcVar5 = fgets((char *)&line,0x4000,local_30);
            bVar7 = pcVar5 != (char *)0x0;
          }
          if (!bVar7) goto LAB_001657d1;
          local_4078 = &line;
          pcVar5 = NextWord((char **)&local_4078);
          if (((*pcVar5 != '\0') && ((char)*local_4078 != '#')) &&
             ((f._4_4_ = f._4_4_ + 1, this->skip < 1 || (this->skip < f._4_4_)))) {
            Output::Output(&local_4080,InfoPrefix);
            pOVar3 = Output::operator<<(&local_4080,&this->fileName);
            pOVar3 = Output::operator<<(pOVar3,(char (*) [7])0x179216);
            pOVar3 = Output::operator<<(pOVar3,(int *)&f);
            end._7_1_ = 0x20;
            pOVar3 = Output::operator<<(pOVar3,(char *)((long)&end + 7));
            Output::operator<<(pOVar3,(char **)&local_4078);
            Output::~Output(&local_4080);
            NormalizeString((char **)&local_4078);
            pCVar1 = (this->super_BackgroundCommand).engine;
            iVar2 = (*pCVar1->_vptr_ChessEngine[9])(pCVar1,local_4078);
            local_4078 = (int *)CONCAT44(extraout_var,iVar2);
            if (local_4078 == (int *)0x0) {
LAB_001657d1:
              local_4098 = Now();
              local_4098 = local_4098 - pcount;
              if ((this->qperft & 1U) == 0) {
                Output::Output(&local_40d0,InfoPrefix);
                pOVar3 = Output::operator<<(&local_40d0,(char (*) [13])"Total Perft ");
                pOVar3 = Output::operator<<(pOVar3,&nodes);
                local_40d1 = ' ';
                pOVar3 = Output::operator<<(pOVar3,&local_40d1);
                local_40e0 = Rate(nodes / 1000,local_4098);
                pOVar3 = Output::operator<<(pOVar3,&local_40e0);
                Output::operator<<(pOVar3,(char (*) [12])" KLeafs/sec");
                Output::~Output(&local_40d0);
                Output::Output(&local_40e8,InfoPrefix);
                pOVar3 = Output::operator<<(&local_40e8,(char (*) [13])"Total Nodes ");
                pOVar3 = Output::operator<<(pOVar3,&qnodes);
                local_40e9 = ' ';
                pOVar3 = Output::operator<<(pOVar3,&local_40e9);
                local_40f8 = Rate(qnodes / 1000,local_4098);
                pOVar3 = Output::operator<<(pOVar3,&local_40f8);
                Output::operator<<(pOVar3,(char (*) [12])" KNodes/sec");
                Output::~Output(&local_40e8);
              }
              else {
                Output::Output(&local_40a0,InfoPrefix);
                pOVar3 = Output::operator<<(&local_40a0,(char (*) [14])"Total QPerft ");
                pOVar3 = Output::operator<<(pOVar3,&nodes);
                local_40a1 = ' ';
                pOVar3 = Output::operator<<(pOVar3,&local_40a1);
                local_40b0 = Rate(nodes / 1000,local_4098);
                pOVar3 = Output::operator<<(pOVar3,&local_40b0);
                Output::operator<<(pOVar3,(char (*) [12])" KNodes/sec");
                Output::~Output(&local_40a0);
                Output::Output(&local_40b8,InfoPrefix);
                pOVar3 = Output::operator<<(&local_40b8,(char (*) [14])"Total Snodes ");
                local_40c0 = qnodes - uStack_60;
                pOVar3 = Output::operator<<(pOVar3,&local_40c0);
                pOVar3 = Output::operator<<(pOVar3,(char (*) [10])", Qnodes ");
                pOVar3 = Output::operator<<(pOVar3,&stack0xffffffffffffffa0);
                pOVar3 = Output::operator<<(pOVar3,(char (*) [3])0x1785fb);
                local_40c8 = Percent(uStack_60,nodes);
                pOVar3 = Output::operator<<(pOVar3,&local_40c8);
                Output::operator<<(pOVar3,(char (*) [3])"%)");
                Output::~Output(&local_40b8);
              }
              if (local_30 == (FILE *)0x0) {
                return;
              }
              fclose(local_30);
              return;
            }
            while( true ) {
              bVar7 = false;
              if (local_4078 != (int *)0x0) {
                bVar7 = (char)*local_4078 != '\0';
              }
              if (!bVar7) goto LAB_0016579a;
              time = (uint64_t)strchr((char *)local_4078,0x3b);
              if ((char *)time != (char *)0x0) {
                *(char *)time = '\0';
              }
              pcVar5 = NextWord((char **)&local_4078);
              if (((*pcVar5 == 'D') &&
                  (iVar2 = isdigit((int)*(char *)((long)local_4078 + 1)), iVar2 != 0)) &&
                 (bVar7 = Process(this,(char *)local_4078,&nodes,&qnodes,&stack0xffffffffffffffa0),
                 !bVar7)) break;
              if (time == 0) goto LAB_0016579a;
              local_4078 = (int *)(time + 1);
            }
            fen[0x3fff] = '\x01';
LAB_0016579a:
            if ((0 < this->count) && (this->count <= f._4_4_)) goto LAB_001657d1;
          }
          f._0_4_ = (int)f + 1;
        } while( true );
      }
      Output::Output(&local_38,InfoPrefix);
      pOVar3 = Output::operator<<(&local_38,(char (*) [14])"Cannot open \'");
      pOVar3 = Output::operator<<(pOVar3,&this->fileName);
      pOVar3 = Output::operator<<(pOVar3,(char (*) [4])"\': ");
      piVar6 = __errno_location();
      start = (uint64_t)strerror(*piVar6);
      Output::operator<<(pOVar3,(char **)&start);
      Output::~Output(&local_38);
    }
    else if ((this->qperft & 1U) == 0) {
      ChessEngine::Perft((this->super_BackgroundCommand).engine,this->maxDepth);
    }
    else {
      ChessEngine::QPerft((this->super_BackgroundCommand).engine,this->maxDepth);
    }
  }
  return;
}

Assistant:

void PerftCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for '" << command << "' command";
    return;
  }

  engine->ClearStopFlags();

  if (fileName.empty()) {
    if (qperft) {
      engine->QPerft(maxDepth);
    }
    else {
      engine->Perft(maxDepth);
    }
    return;
  }

  FILE* fp = NULL;
  try {
    if (!(fp = fopen(fileName.c_str(), "r"))) {
      Output() << "Cannot open '" << fileName << "': " << strerror(errno);
      return;
    }

    const uint64_t start = Now();
    uint64_t pcount = 0;
    uint64_t nodes = 0;
    uint64_t qnodes = 0;
    bool done = false;
    char fen[16384];
    int positions = 0;

    for (int line = 1; !done && fgets(fen, sizeof(fen), fp); ++line) {
      char* f = fen;
      if (!*NextWord(f) || (*f == '#')) {
        continue;
      }

      positions++;
      if ((skip > 0) && (positions <= skip)) {
        continue;
      }

      Output() << fileName << " line " << line << ' ' << f;
      NormalizeString(f);
      if (!(f = const_cast<char*>(engine->SetPosition(f)))) {
        break;
      }

      while (f && *f) {
        // null terminate this parameter (parameters end with ; or end of line)
        char* end = strchr(f, ';');
        if (end) {
          *end = 0;
        }

        // process "D<depth> <leafs>" parameters (e.g. D5 4865609)
        if ((*NextWord(f) == 'D') && isdigit(f[1])) {
          if (!Process(f, pcount, nodes, qnodes)) {
            done = true;
            break;
          }
        }

        // move 'f' to beginning of next parameter
        if (end) {
          f = (end + 1);
          continue;
        }
        break;
      }

      if ((count > 0) && (positions >= count)) {
        break;
      }
    }

    const uint64_t time = (Now() - start);
    if (qperft) {
      Output() << "Total QPerft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KNodes/sec";
      Output() << "Total Snodes " << (nodes - qnodes) << ", Qnodes " << qnodes
               << " (" << Percent(qnodes, pcount) << "%)";
    }
    else {
      Output() << "Total Perft " << pcount << ' '
               << Rate((pcount / 1000), time) << " KLeafs/sec";
      Output() << "Total Nodes " << nodes << ' '
               << Rate((nodes / 1000), time) << " KNodes/sec";
    }
  }
  catch (const std::exception& e) {
    Output() << "ERROR: " << e.what();
  }
  catch (...) {
    Output() << "Unknown error!";
  }

  if (fp) {
    fclose(fp);
    fp = NULL;
  }
}